

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcAttach.c
# Opt level: O0

int Abc_NtkAttach(Abc_Ntk_t *pNtk)

{
  int iVar1;
  Mio_Library_t *pLib;
  void *pvVar2;
  Mio_Gate_t *pMVar3;
  char *pcVar4;
  int local_74;
  int i;
  int nFanins;
  int nGates;
  Mio_Gate_t **ppGates;
  Abc_Obj_t *pNode;
  uint uTruths [6] [2];
  uint **puTruthGates;
  Mio_Library_t *pGenlib;
  Abc_Ntk_t *pNtk_local;
  
  iVar1 = Abc_NtkIsSopLogic(pNtk);
  if (iVar1 == 0) {
    __assert_fail("Abc_NtkIsSopLogic(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abci/abcAttach.c"
                  ,0x45,"int Abc_NtkAttach(Abc_Ntk_t *)");
  }
  pLib = (Mio_Library_t *)Abc_FrameReadLibGen();
  if (pLib == (Mio_Library_t *)0x0) {
    printf("The current library is not available.\n");
    pNtk_local._4_4_ = 0;
  }
  else {
    Abc_AttachSetupTruthTables((uint (*) [2])&pNode);
    _nFanins = Mio_CollectRoots(pLib,6,1e+20,1,&i,0);
    uTruths[5] = (uint  [2])malloc((long)i << 3);
    pvVar2 = malloc((long)(i << 1) << 2);
    *(void **)uTruths[5] = pvVar2;
    for (local_74 = 1; local_74 < i; local_74 = local_74 + 1) {
      *(long *)((long)uTruths[5] + (long)local_74 * 8) =
           *(long *)((long)uTruths[5] + (long)(local_74 + -1) * 8) + 8;
    }
    for (local_74 = 0; local_74 < i; local_74 = local_74 + 1) {
      pMVar3 = _nFanins[local_74];
      iVar1 = Mio_GateReadPinNum(_nFanins[local_74]);
      Mio_DeriveTruthTable
                (pMVar3,(uint (*) [2])&pNode,iVar1,6,
                 *(uint **)((long)uTruths[5] + (long)local_74 * 8));
    }
    Abc_NtkCleanCopy(pNtk);
    for (local_74 = 0; iVar1 = Vec_PtrSize(pNtk->vObjs), local_74 < iVar1; local_74 = local_74 + 1)
    {
      ppGates = (Mio_Gate_t **)Abc_NtkObj(pNtk,local_74);
      if (((Abc_Obj_t *)ppGates != (Abc_Obj_t *)0x0) &&
         (iVar1 = Abc_ObjIsNode((Abc_Obj_t *)ppGates), iVar1 != 0)) {
        iVar1 = Abc_ObjFaninNum((Abc_Obj_t *)ppGates);
        if (iVar1 == 0) {
          iVar1 = Abc_SopIsConst1((char *)ppGates[7]);
          if (iVar1 == 0) {
            pMVar3 = Mio_LibraryReadConst0(pLib);
            ppGates[8] = pMVar3;
          }
          else {
            pMVar3 = Mio_LibraryReadConst1(pLib);
            ppGates[8] = pMVar3;
          }
        }
        else if (iVar1 == 1) {
          iVar1 = Abc_SopIsBuf((char *)ppGates[7]);
          if (iVar1 == 0) {
            pMVar3 = Mio_LibraryReadInv(pLib);
            ppGates[8] = pMVar3;
          }
          else {
            pMVar3 = Mio_LibraryReadBuf(pLib);
            ppGates[8] = pMVar3;
          }
        }
        else {
          if (6 < iVar1) {
            pcVar4 = Abc_ObjName((Abc_Obj_t *)ppGates);
            printf("Cannot attach gate with more than 6 inputs to node %s.\n",pcVar4);
            if (*(long *)uTruths[5] != 0) {
              free(*(void **)uTruths[5]);
              *(undefined8 *)uTruths[5] = 0;
            }
            if (uTruths[5] != (uint  [2])0x0) {
              free((void *)uTruths[5]);
              uTruths[5][0] = 0;
              uTruths[5][1] = 0;
            }
            if (_nFanins != (Mio_Gate_t **)0x0) {
              free(_nFanins);
            }
            return 0;
          }
          iVar1 = Abc_NodeAttach((Abc_Obj_t *)ppGates,_nFanins,(uint **)uTruths[5],i,
                                 (uint (*) [2])&pNode);
          if (iVar1 == 0) {
            pcVar4 = Abc_ObjName((Abc_Obj_t *)ppGates);
            printf("Could not attach the library gate to node %s.\n",pcVar4);
            if (*(long *)uTruths[5] != 0) {
              free(*(void **)uTruths[5]);
              *(undefined8 *)uTruths[5] = 0;
            }
            if (uTruths[5] != (uint  [2])0x0) {
              free((void *)uTruths[5]);
              uTruths[5][0] = 0;
              uTruths[5][1] = 0;
            }
            if (_nFanins != (Mio_Gate_t **)0x0) {
              free(_nFanins);
            }
            return 0;
          }
        }
      }
    }
    if (*(long *)uTruths[5] != 0) {
      free(*(void **)uTruths[5]);
      *(undefined8 *)uTruths[5] = 0;
    }
    if (uTruths[5] != (uint  [2])0x0) {
      free((void *)uTruths[5]);
      uTruths[5][0] = 0;
      uTruths[5][1] = 0;
    }
    if (_nFanins != (Mio_Gate_t **)0x0) {
      free(_nFanins);
      _nFanins = (Mio_Gate_t **)0x0;
    }
    if (s_pPerms != (char **)0x0) {
      free(s_pPerms);
      s_pPerms = (char **)0x0;
    }
    for (local_74 = 0; iVar1 = Vec_PtrSize(pNtk->vObjs), local_74 < iVar1; local_74 = local_74 + 1)
    {
      ppGates = (Mio_Gate_t **)Abc_NtkObj(pNtk,local_74);
      if ((((Abc_Obj_t *)ppGates != (Abc_Obj_t *)0x0) &&
          (iVar1 = Abc_ObjIsNode((Abc_Obj_t *)ppGates), iVar1 != 0)) &&
         (ppGates[8] == (Mio_Gate_t *)0x0)) {
        printf("Some elementary gates (constant, buffer, or inverter) are missing in the library.\n"
              );
        return 0;
      }
    }
    for (local_74 = 0; iVar1 = Vec_PtrSize(pNtk->vObjs), local_74 < iVar1; local_74 = local_74 + 1)
    {
      ppGates = (Mio_Gate_t **)Abc_NtkObj(pNtk,local_74);
      if (((Abc_Obj_t *)ppGates != (Abc_Obj_t *)0x0) &&
         (iVar1 = Abc_ObjIsNode((Abc_Obj_t *)ppGates), iVar1 != 0)) {
        ppGates[7] = ppGates[8];
        ppGates[8] = (Mio_Gate_t *)0x0;
      }
    }
    pNtk->ntkFunc = ABC_FUNC_MAP;
    Extra_MmFlexStop((Extra_MmFlex_t *)pNtk->pManFunc);
    pNtk->pManFunc = pLib;
    printf("Library gates are successfully attached to the nodes.\n");
    iVar1 = Abc_NtkCheck(pNtk);
    if (iVar1 == 0) {
      printf("Abc_NtkAttach: The network check has failed.\n");
      pNtk_local._4_4_ = 0;
    }
    else {
      pNtk_local._4_4_ = 1;
    }
  }
  return pNtk_local._4_4_;
}

Assistant:

int Abc_NtkAttach( Abc_Ntk_t * pNtk )
{
    Mio_Library_t * pGenlib;
    unsigned ** puTruthGates;
    unsigned uTruths[6][2];
    Abc_Obj_t * pNode;
    Mio_Gate_t ** ppGates;
    int nGates, nFanins, i;

    assert( Abc_NtkIsSopLogic(pNtk) );

    // check that the library is available
    pGenlib = (Mio_Library_t *)Abc_FrameReadLibGen();
    if ( pGenlib == NULL )
    {
        printf( "The current library is not available.\n" );
        return 0;
    }

    // start the truth tables
    Abc_AttachSetupTruthTables( uTruths );
    
    // collect all the gates
    ppGates = Mio_CollectRoots( pGenlib, 6, (float)1.0e+20, 1, &nGates, 0 );

    // derive the gate truth tables
    puTruthGates    = ABC_ALLOC( unsigned *, nGates );
    puTruthGates[0] = ABC_ALLOC( unsigned, 2 * nGates );
    for ( i = 1; i < nGates; i++ )
        puTruthGates[i] = puTruthGates[i-1] + 2;
    for ( i = 0; i < nGates; i++ )
        Mio_DeriveTruthTable( ppGates[i], uTruths, Mio_GateReadPinNum(ppGates[i]), 6, puTruthGates[i] );

    // assign the gates to pNode->pCopy
    Abc_NtkCleanCopy( pNtk );
    Abc_NtkForEachNode( pNtk, pNode, i )
    {
        nFanins = Abc_ObjFaninNum(pNode);
        if ( nFanins == 0 )
        {
            if ( Abc_SopIsConst1((char *)pNode->pData) )
                pNode->pCopy = (Abc_Obj_t *)Mio_LibraryReadConst1(pGenlib);
            else
                pNode->pCopy = (Abc_Obj_t *)Mio_LibraryReadConst0(pGenlib);
        }
        else if ( nFanins == 1 )
        {
            if ( Abc_SopIsBuf((char *)pNode->pData) )
                pNode->pCopy = (Abc_Obj_t *)Mio_LibraryReadBuf(pGenlib);
            else
                pNode->pCopy = (Abc_Obj_t *)Mio_LibraryReadInv(pGenlib);
        }
        else if ( nFanins > 6 )
        {
            printf( "Cannot attach gate with more than 6 inputs to node %s.\n", Abc_ObjName(pNode) );
            ABC_FREE( puTruthGates[0] );
            ABC_FREE( puTruthGates );
            ABC_FREE( ppGates );
            return 0;
        }
        else if ( !Abc_NodeAttach( pNode, ppGates, puTruthGates, nGates, uTruths ) )
        {
            printf( "Could not attach the library gate to node %s.\n", Abc_ObjName(pNode) );
            ABC_FREE( puTruthGates[0] );
            ABC_FREE( puTruthGates );
            ABC_FREE( ppGates );
            return 0;
        }
    }
    ABC_FREE( puTruthGates[0] );
    ABC_FREE( puTruthGates );
    ABC_FREE( ppGates );
    ABC_FREE( s_pPerms );

    // perform the final transformation
    Abc_NtkForEachNode( pNtk, pNode, i )
    {
        if ( pNode->pCopy == NULL )
        {
            printf( "Some elementary gates (constant, buffer, or inverter) are missing in the library.\n" );
            return 0;
        }
    }

    // replace SOP representation by the gate representation
    Abc_NtkForEachNode( pNtk, pNode, i )
        pNode->pData = pNode->pCopy, pNode->pCopy = NULL;
    pNtk->ntkFunc = ABC_FUNC_MAP;
    Extra_MmFlexStop( (Extra_MmFlex_t *)pNtk->pManFunc );
    pNtk->pManFunc = pGenlib;

    printf( "Library gates are successfully attached to the nodes.\n" );

    // make sure that everything is okay
    if ( !Abc_NtkCheck( pNtk ) )
    {
        printf( "Abc_NtkAttach: The network check has failed.\n" );
        return 0;
    }
    return 1;
}